

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::base_access<7>::minus_overflows<units::detail::unit_data>
               (unit_data *a,unit_data *b)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ((int)*a << 8) >> 0x1d;
  iVar2 = ((int)*b << 8) >> 0x1d;
  if (iVar2 < 0) {
    return iVar2 + 3 < iVar1;
  }
  if ((uint)((int)*b << 8) < 0x20000000) {
    return false;
  }
  return iVar1 < iVar2 + -4;
}

Assistant:

constexpr int radian() const { return radians_; }